

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

void __thiscall wabt::interp::Thread::Mark(Thread *this,Store *store)

{
  ulong *puVar1;
  Enum EVar2;
  pointer pFVar3;
  _Bit_type *p_Var4;
  ulong uVar5;
  uint *puVar6;
  pointer pVVar7;
  Frame *frame;
  pointer pFVar8;
  uint *puVar9;
  ulong uVar10;
  
  pFVar8 = (this->frames_).
           super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>._M_impl.
           super__Vector_impl_data._M_start;
  pFVar3 = (this->frames_).
           super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pFVar8 != pFVar3) {
    p_Var4 = (store->marks_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    do {
      uVar5 = (pFVar8->func).index;
      uVar10 = uVar5 + 0x3f;
      if (-1 < (long)uVar5) {
        uVar10 = uVar5;
      }
      puVar1 = p_Var4 + ((long)uVar10 >> 6) +
                        (ulong)((uVar5 & 0x800000000000003f) < 0x8000000000000001) +
                        0xffffffffffffffff;
      *puVar1 = *puVar1 | 1L << ((byte)uVar5 & 0x3f);
      pFVar8 = pFVar8 + 1;
    } while (pFVar8 != pFVar3);
  }
  puVar9 = (this->refs_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = (this->refs_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar9 != puVar6) {
    pVVar7 = (this->values_).
             super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
             super__Vector_impl_data._M_start;
    p_Var4 = (store->marks_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    do {
      EVar2 = pVVar7[*puVar9].type.enum_;
      if ((EVar2 != ExternRef) && (EVar2 != Any)) {
        __assert_fail("t == type || type == ValueType::Any",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/interp/interp.h"
                      ,0x22d,"void wabt::interp::Value::CheckType(ValueType) const");
      }
      uVar5 = pVVar7[*puVar9].field_0.i64_;
      uVar10 = uVar5 + 0x3f;
      if (-1 < (long)uVar5) {
        uVar10 = uVar5;
      }
      puVar1 = p_Var4 + ((long)uVar10 >> 6) +
                        (ulong)((uVar5 & 0x800000000000003f) < 0x8000000000000001) +
                        0xffffffffffffffff;
      *puVar1 = *puVar1 | 1L << ((byte)uVar5 & 0x3f);
      puVar9 = puVar9 + 1;
    } while (puVar9 != puVar6);
  }
  return;
}

Assistant:

void Thread::Mark(Store& store) {
  for (auto&& frame : frames_) {
    frame.Mark(store);
  }
  for (auto index: refs_) {
    store.Mark(values_[index].Get<Ref>());
  }
}